

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * HelpExampleCliNamed(string *__return_storage_ptr__,string *methodname,RPCArgList *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  byte bVar1;
  pointer ppVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  string *__str;
  byte *pbVar5;
  pointer pcVar6;
  pointer __rhs;
  byte *pbVar7;
  long in_FS_OFFSET;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [72];
  pointer local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+(__return_storage_ptr__,"> bitcoin-cli -named ",methodname);
  __rhs = (args->
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (args->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x40);
  do {
    if (__rhs == ppVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\n");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    if ((__rhs->second).typ == VSTR) {
      __str = UniValue::get_str_abi_cxx11_(&__rhs->second);
      std::__cxx11::string::string((string *)local_98,__str);
    }
    else {
      UniValue::write_abi_cxx11_((UniValue *)local_98,(int)&__rhs->second,(void *)0x0,0);
    }
    std::operator+(&local_f8," ",&__rhs->first);
    std::operator+(&local_d8,&local_f8,"=");
    pbVar5 = (byte *)(local_98._8_8_ + local_98._0_8_);
    for (pbVar7 = (byte *)local_98._0_8_; pbVar7 != pbVar5; pbVar7 = pbVar7 + 1) {
      bVar1 = *pbVar7;
      if (((ulong)bVar1 < 0x28) && ((0x8500000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        local_98._64_8_ = &local_48;
        local_50 = (pointer)0x0;
        local_48._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                  (this,local_98._8_8_ * 2);
        uVar4 = local_98._8_8_;
        uVar3 = local_98._0_8_;
        for (pcVar6 = (pointer)0x0; (pointer)uVar4 != pcVar6; pcVar6 = pcVar6 + 1) {
          if (*(byte *)(uVar3 + (long)pcVar6) == 0x27) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (this,"\'\'\'");
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(this,*(byte *)(uVar3 + (long)pcVar6));
          }
        }
        __return_storage_ptr___00 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x20);
        std::operator+(__return_storage_ptr___00,"\'",this);
        std::operator+(&local_118,__return_storage_ptr___00,"\'");
        std::__cxx11::string::~string((string *)__return_storage_ptr___00);
        std::__cxx11::string::~string((string *)this);
        if ((bVar1 < 0x28) && ((0x8500000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))
        goto LAB_005a0fd8;
      }
    }
    std::__cxx11::string::string
              ((string *)&local_118,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
LAB_005a0fd8:
    std::operator+(&local_b8,&local_d8,&local_118);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)local_98);
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

std::string HelpExampleCliNamed(const std::string& methodname, const RPCArgList& args)
{
    std::string result = "> bitcoin-cli -named " + methodname;
    for (const auto& argpair: args) {
        const auto& value = argpair.second.isStr()
                ? argpair.second.get_str()
                : argpair.second.write();
        result += " " + argpair.first + "=" + ShellQuoteIfNeeded(value);
    }
    result += "\n";
    return result;
}